

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  TValue *pTVar1;
  GCstr *pGVar2;
  ulong uVar3;
  lua_State *in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  GCstr *s;
  TValue *o;
  cTValue *in_stack_ffffffffffffff98;
  
  pTVar1 = index2adr(in_RDI,in_ESI);
  if ((pTVar1->field_2).it == 0xfffffffb) {
    pGVar2 = (GCstr *)(ulong)(pTVar1->u32).lo;
  }
  else {
    if (0xfffeffff < (pTVar1->field_2).it) {
      if (in_RDX != (lua_State *)0x0) {
        in_RDX->nextgc = 0;
        in_RDX->marked = '\0';
        in_RDX->gct = '\0';
        in_RDX->dummy_ffid = '\0';
        in_RDX->status = '\0';
      }
      return (char *)0x0;
    }
    if (*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x24) <=
        *(uint *)((ulong)(in_RDI->glref).ptr32 + 0x20)) {
      lj_gc_step(in_RDX);
    }
    pTVar1 = index2adr(in_RDI,in_ESI);
    pGVar2 = lj_str_fromnumber((lua_State *)&pTVar1->field_2,in_stack_ffffffffffffff98);
    (pTVar1->u32).lo = (uint32_t)pGVar2;
    (pTVar1->field_2).it = 0xfffffffb;
  }
  if (in_RDX != (lua_State *)0x0) {
    uVar3 = (ulong)pGVar2->len;
    in_RDX->nextgc = (GCRef)(int)uVar3;
    in_RDX->marked = (char)(uVar3 >> 0x20);
    in_RDX->gct = (char)(uVar3 >> 0x28);
    in_RDX->dummy_ffid = (char)(uVar3 >> 0x30);
    in_RDX->status = (char)(uVar3 >> 0x38);
  }
  return (char *)(pGVar2 + 1);
}

Assistant:

LUA_API const char *lua_tolstring(lua_State *L, int idx, size_t *len)
{
  TValue *o = index2adr(L, idx);
  GCstr *s;
  if (LJ_LIKELY(tvisstr(o))) {
    s = strV(o);
  } else if (tvisnumber(o)) {
    lj_gc_check(L);
    o = index2adr(L, idx);  /* GC may move the stack. */
    s = lj_str_fromnumber(L, o);
    setstrV(L, o, s);
  } else {
    if (len != NULL) *len = 0;
    return NULL;
  }
  if (len != NULL) *len = s->len;
  return strdata(s);
}